

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<tinyusdz::Extent>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *attr,string *name,
                   uint32_t indent)

{
  char cVar1;
  Path *v;
  undefined8 uVar2;
  undefined8 uVar3;
  Extent v_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  value_type *pvVar8;
  ostream *poVar9;
  long lVar10;
  uint32_t indent_00;
  pointer pPVar11;
  undefined8 uVar12;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  stringstream ss;
  string local_258;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> local_220;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar4 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::authored(attr);
  if (!bVar4) goto LAB_00247aee;
  bVar5 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::is_value_empty(attr);
  pPVar11 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar14 = pPVar11 !=
           (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  bVar4 = (attr->_attrib).has_value_;
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::optional
            (&local_220,&attr->_attrib);
  if (local_220.has_value_ == true) {
    pvVar8 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                       (&local_220);
    cVar1 = pvVar8->_has_value;
  }
  else {
    cVar1 = '\0';
  }
  if ((local_220.has_value_ & 1U) == 0) {
    bVar6 = false;
  }
  else {
    pvVar8 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                       (&local_220);
    bVar6 = Animatable<tinyusdz::Extent>::has_timesamples(pvVar8);
  }
  if ((((local_220.has_value_ & 1U) == 0) ||
      (pvVar8 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                          (&local_220), pvVar8->_blocked != false)) || (pvVar8->_has_value != false)
     ) {
    bVar15 = false;
  }
  else {
    pPVar11 = (pointer)(pvVar8->_ts)._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    bVar15 = pPVar11 !=
             (pointer)(pvVar8->_ts)._samples.
                      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  }
  indent_00 = (uint32_t)pPVar11;
  bVar7 = AttrMetas::authored(&attr->_metas);
  if (((bVar7) || ((byte)(bVar14 & (bVar4 ^ 1U) | bVar15) != 1)) ||
     (n_01 = n, (bVar5 || attr->_blocked != false) || cVar1 != '\0')) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)&local_258);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
    poVar9 = ::std::operator<<(local_1a8,(string *)&local_258);
    poVar9 = ::std::operator<<(poVar9," ");
    ::std::operator<<(poVar9,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      pcVar13 = " = None";
LAB_00247894:
      ::std::operator<<(local_1a8,pcVar13);
    }
    else if (cVar1 != '\0') {
      pvVar8 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                         (&local_220);
      if ((pvVar8->_blocked != false) || (pvVar8->_has_value != true)) {
        pcVar13 = " = [InternalError]";
        goto LAB_00247894;
      }
      uVar2 = *(undefined8 *)(pvVar8->_value).lower._M_elems;
      uVar3 = *(undefined8 *)((pvVar8->_value).lower._M_elems + 2);
      uVar12 = *(undefined8 *)((pvVar8->_value).upper._M_elems + 1);
      v_00 = pvVar8->_value;
      poVar9 = ::std::operator<<(local_1a8," = ");
      local_238 = uVar2;
      uStack_230 = uVar3;
      local_228 = uVar12;
      ::std::operator<<(poVar9,v_00);
      indent_00 = (uint32_t)uVar12;
    }
    bVar4 = AttrMetas::authored(&attr->_metas);
    if (bVar4) {
      poVar9 = ::std::operator<<(local_1a8,"(\n");
      print_attr_metas_abi_cxx11_
                (&local_258,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar9 = ::std::operator<<(poVar9,(string *)&local_258);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar9 = ::std::operator<<(poVar9,(string *)&local_1d8);
      ::std::operator<<(poVar9,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX;
  }
  if (bVar6 != false) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)&local_258);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
    poVar9 = ::std::operator<<(local_1a8,(string *)&local_258);
    poVar9 = ::std::operator<<(poVar9," ");
    ::std::operator<<(poVar9,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    poVar9 = ::std::operator<<(local_1a8,".timeSamples = ");
    pvVar8 = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value
                       (&local_220);
    print_typed_timesamples<tinyusdz::Extent>(&local_258,&pvVar8->_ts,indent);
    ::std::operator<<(poVar9,(string *)&local_258);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"\n");
    n_01 = extraout_EDX_00;
  }
  if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pprint::Indent_abi_cxx11_(&local_258,(pprint *)(ulong)indent,n_01);
    ::std::operator<<(local_1a8,(string *)&local_258);
    ::std::__cxx11::string::_M_dispose();
    value::TypeTraits<tinyusdz::Extent>::type_name_abi_cxx11_();
    poVar9 = ::std::operator<<(local_1a8,(string *)&local_258);
    poVar9 = ::std::operator<<(poVar9," ");
    ::std::operator<<(poVar9,(string *)name);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar10 = ((long)(attr->_paths).
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar10 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar10 == 1) {
      ::std::operator<<(local_1a8,v);
    }
    else {
      ::std::operator<<(local_1a8,&attr->_paths);
    }
    ::std::operator<<(local_1a8,"\n");
  }
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional(&local_220);
LAB_00247aee:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}